

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int cram_close(cram_fd *fd)

{
  int iVar1;
  spare_bams *psVar2;
  int iVar3;
  ssize_t sVar4;
  int local_30;
  int max_rec;
  int i_1;
  int i;
  spare_bams *next;
  spare_bams *bl;
  cram_fd *fd_local;
  
  if (fd == (cram_fd *)0x0) {
    return -1;
  }
  if ((fd->mode == 0x77) && (fd->ctr != (cram_container *)0x0)) {
    if (fd->ctr->slice != (cram_slice *)0x0) {
      fd->ctr->curr_slice = fd->ctr->curr_slice + 1;
    }
    iVar3 = cram_flush_container_mt(fd,fd->ctr);
    if (iVar3 == -1) {
      return -1;
    }
  }
  if (fd->pool != (t_pool *)0x0) {
    t_pool_flush(fd->pool);
    iVar3 = cram_flush_result(fd);
    if (iVar3 != 0) {
      return -1;
    }
    pthread_mutex_destroy((pthread_mutex_t *)&fd->metrics_lock);
    pthread_mutex_destroy((pthread_mutex_t *)&fd->ref_lock);
    pthread_mutex_destroy((pthread_mutex_t *)&fd->bam_list_lock);
    fd->ctr = (cram_container *)0x0;
    t_results_queue_destroy(fd->rqueue);
  }
  if (fd->mode == 0x77) {
    if (fd->version >> 8 == 3) {
      sVar4 = hwrite(fd->fp,"\x0f",0x26);
      if (sVar4 != 0x26) {
        return -1;
      }
    }
    else {
      sVar4 = hwrite(fd->fp,"\v",0x1e);
      if (sVar4 != 0x1e) {
        return -1;
      }
    }
  }
  next = fd->bl;
  while (next != (spare_bams *)0x0) {
    iVar3 = fd->seqs_per_slice;
    iVar1 = fd->slices_per_container;
    psVar2 = next->next;
    for (local_30 = 0; local_30 < iVar3 * iVar1; local_30 = local_30 + 1) {
      if (next->bams[local_30] != (bam_seq_t *)0x0) {
        bam_destroy1(next->bams[local_30]);
      }
    }
    free(next->bams);
    free(next);
    next = psVar2;
  }
  iVar3 = hclose(fd->fp);
  if (iVar3 == 0) {
    if (fd->file_def != (cram_file_def *)0x0) {
      cram_free_file_def(fd->file_def);
    }
    if (fd->header != (SAM_hdr *)0x0) {
      sam_hdr_free(fd->header);
    }
    free(fd->prefix);
    if (fd->ctr != (cram_container *)0x0) {
      cram_free_container(fd->ctr);
    }
    if (fd->refs != (refs_t *)0x0) {
      refs_free(fd->refs);
    }
    if (fd->ref_free != (char *)0x0) {
      free(fd->ref_free);
    }
    for (max_rec = 0; max_rec < 0x2f; max_rec = max_rec + 1) {
      if (fd->m[max_rec] != (cram_metrics *)0x0) {
        free(fd->m[max_rec]);
      }
    }
    if (fd->index != (cram_index *)0x0) {
      cram_index_free(fd);
    }
    if ((fd->own_pool != 0) && (fd->pool != (t_pool *)0x0)) {
      t_pool_destroy(fd->pool,0);
    }
    free(fd);
    fd_local._4_4_ = 0;
  }
  else {
    fd_local._4_4_ = -1;
  }
  return fd_local._4_4_;
}

Assistant:

int cram_close(cram_fd *fd) {
    spare_bams *bl, *next;
    int i;
	
    if (!fd)
	return -1;

    if (fd->mode == 'w' && fd->ctr) {
	if(fd->ctr->slice)
	    fd->ctr->curr_slice++;
	if (-1 == cram_flush_container_mt(fd, fd->ctr))
	    return -1;
    }

    if (fd->pool) {
	t_pool_flush(fd->pool);

	if (0 != cram_flush_result(fd))
	    return -1;

	pthread_mutex_destroy(&fd->metrics_lock);
	pthread_mutex_destroy(&fd->ref_lock);
	pthread_mutex_destroy(&fd->bam_list_lock);

	fd->ctr = NULL; // prevent double freeing

	//fprintf(stderr, "CRAM: destroy queue %p\n", fd->rqueue);

	t_results_queue_destroy(fd->rqueue);
    }

    if (fd->mode == 'w') {
	/* Write EOF block */
	if (CRAM_MAJOR_VERS(fd->version) == 3) {
	    if (38 != hwrite(fd->fp,
			     "\x0f\x00\x00\x00\xff\xff\xff\xff" // Cont HDR
			     "\x0f\xe0\x45\x4f\x46\x00\x00\x00" // Cont HDR
			     "\x00\x01\x00"                     // Cont HDR
			     "\x05\xbd\xd9\x4f"                 // CRC32
			     "\x00\x01\x00\x06\x06"             // Comp.HDR blk
			     "\x01\x00\x01\x00\x01\x00"         // Comp.HDR blk
			     "\xee\x63\x01\x4b",                // CRC32
			     38))
		return -1;
	} else {
	    if (30 != hwrite(fd->fp,
			     "\x0b\x00\x00\x00\xff\xff\xff\xff"
			     "\x0f\xe0\x45\x4f\x46\x00\x00\x00"
			     "\x00\x01\x00\x00\x01\x00\x06\x06"
			     "\x01\x00\x01\x00\x01\x00", 30))
		return -1;
	}
    }

    for (bl = fd->bl; bl; bl = next) {
	int i, max_rec = fd->seqs_per_slice * fd->slices_per_container;

	next = bl->next;
	for (i = 0; i < max_rec; i++) {
	    if (bl->bams[i])
		bam_free(bl->bams[i]);
	}
	free(bl->bams);
	free(bl);
    }

    if (hclose(fd->fp) != 0)
	return -1;

    if (fd->file_def)
	cram_free_file_def(fd->file_def);

    if (fd->header)
	sam_hdr_free(fd->header);

    free(fd->prefix);

    if (fd->ctr)
	cram_free_container(fd->ctr);

    if (fd->refs)
	refs_free(fd->refs);
    if (fd->ref_free)
        free(fd->ref_free);

    for (i = 0; i < DS_END; i++)
	if (fd->m[i])
	    free(fd->m[i]);

    if (fd->index)
	cram_index_free(fd);

    if (fd->own_pool && fd->pool)
	t_pool_destroy(fd->pool, 0);

    free(fd);
    return 0;
}